

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac__decode_samples_with_residual
                    (ma_dr_flac_bs *bs,ma_uint32 bitsPerSample,ma_uint32 blockSize,
                    ma_uint32 lpcOrder,ma_int32 lpcShift,ma_uint32 lpcPrecision,
                    ma_int32 *coefficients,ma_int32 *pDecodedSamples)

{
  ma_int32 *pResult;
  ma_uint8 mVar1;
  ma_bool32 mVar2;
  ma_bool32 mVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  undefined4 in_register_0000000c;
  ulong uVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  ma_uint8 riceParam;
  ma_uint8 unencodedBitsPerSample;
  byte local_82;
  ma_uint8 partitionOrder;
  uint local_80;
  ma_uint8 residualMethod;
  uint local_78;
  int local_74;
  ma_int32 *local_70;
  ulong local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_68 = CONCAT44(in_register_0000000c,lpcOrder);
  local_80 = lpcShift;
  mVar2 = ma_dr_flac__read_uint8(bs,2,&residualMethod);
  mVar3 = CONCAT31((int3)(mVar2 >> 8),mVar2 == 0);
  if (((residualMethod < 2 && mVar2 != 0) &&
      (mVar3 = ma_dr_flac__read_uint8(bs,4,&partitionOrder), mVar3 != 0)) &&
     (local_78 = (uint)partitionOrder, local_78 < 9)) {
    local_5c = blockSize >> (partitionOrder & 0x1f);
    mVar3 = local_5c - (uint)local_68;
    if ((uint)local_68 <= local_5c) {
      local_70 = pDecodedSamples + (local_68 & 0xffffffff);
      local_74 = 1 << (partitionOrder & 0x1f);
      local_38 = (ulong)local_80;
      local_54 = lpcPrecision + bitsPerSample;
      iVar9 = (uint)local_68 - 1;
      local_82 = residualMethod;
      bVar8 = residualMethod;
      local_48 = (ulong)bitsPerSample;
      local_40 = (ulong)lpcPrecision;
      do {
        riceParam = '\0';
        local_50 = (ulong)mVar3;
        if ((bVar8 & 1) == 0) {
          mVar2 = ma_dr_flac__read_uint8(bs,4,&riceParam);
          if (mVar2 == 0) {
            return 0;
          }
          if (riceParam == '\x0f') goto LAB_0017e159;
LAB_0017e0fc:
          if (riceParam == 0xff) goto LAB_0017e15e;
          mVar2 = ma_dr_flac__decode_samples_with_residual__rice__scalar
                            (bs,(ma_uint32)local_48,mVar3,riceParam,(ma_uint32)local_68,local_80,
                             (ma_uint32)local_40,coefficients,local_70);
          if (mVar2 == 0) {
            return 0;
          }
        }
        else {
          mVar2 = ma_dr_flac__read_uint8(bs,5,&riceParam);
          if (mVar2 == 0) {
            return 0;
          }
          if (riceParam != '\x1f') goto LAB_0017e0fc;
LAB_0017e159:
          riceParam = 0xff;
LAB_0017e15e:
          unencodedBitsPerSample = '\0';
          mVar2 = ma_dr_flac__read_uint8(bs,5,&unencodedBitsPerSample);
          mVar1 = unencodedBitsPerSample;
          if (mVar2 == 0) {
            return 0;
          }
          local_58 = mVar3;
          for (uVar10 = 0; bVar8 = local_82, mVar3 = local_58, uVar10 != local_50;
              uVar10 = uVar10 + 1) {
            pResult = local_70 + uVar10;
            if (mVar1 == '\0') {
              *pResult = 0;
              uVar7 = local_68;
              uVar4 = local_54;
            }
            else {
              mVar3 = ma_dr_flac__read_int32(bs,(uint)mVar1,pResult);
              uVar7 = local_68;
              uVar4 = local_54;
              if (mVar3 == 0) {
                return 0;
              }
            }
            for (; (uint)uVar7 != 0; uVar7 = (ulong)((uint)uVar7 >> 1)) {
              uVar4 = uVar4 + 1;
            }
            if (uVar4 < 0x21) {
              iVar5 = 0;
              switch(iVar9) {
              case 0x1f:
                iVar5 = pResult[-0x20] * coefficients[0x1f];
              case 0x1e:
                iVar5 = iVar5 + pResult[-0x1f] * coefficients[0x1e];
              case 0x1d:
                iVar5 = iVar5 + pResult[-0x1e] * coefficients[0x1d];
              case 0x1c:
                iVar5 = iVar5 + pResult[-0x1d] * coefficients[0x1c];
              case 0x1b:
                iVar5 = iVar5 + pResult[-0x1c] * coefficients[0x1b];
              case 0x1a:
                iVar5 = iVar5 + pResult[-0x1b] * coefficients[0x1a];
              case 0x19:
                iVar5 = iVar5 + pResult[-0x1a] * coefficients[0x19];
              case 0x18:
                iVar5 = iVar5 + pResult[-0x19] * coefficients[0x18];
              case 0x17:
                iVar5 = iVar5 + pResult[-0x18] * coefficients[0x17];
              case 0x16:
                iVar5 = iVar5 + pResult[-0x17] * coefficients[0x16];
              case 0x15:
                iVar5 = iVar5 + pResult[-0x16] * coefficients[0x15];
              case 0x14:
                iVar5 = iVar5 + pResult[-0x15] * coefficients[0x14];
              case 0x13:
                iVar5 = iVar5 + pResult[-0x14] * coefficients[0x13];
              case 0x12:
                iVar5 = iVar5 + pResult[-0x13] * coefficients[0x12];
              case 0x11:
                iVar5 = iVar5 + pResult[-0x12] * coefficients[0x11];
              case 0x10:
                iVar5 = iVar5 + pResult[-0x11] * coefficients[0x10];
              case 0xf:
                iVar5 = iVar5 + pResult[-0x10] * coefficients[0xf];
              case 0xe:
                iVar5 = iVar5 + pResult[-0xf] * coefficients[0xe];
              case 0xd:
                iVar5 = iVar5 + pResult[-0xe] * coefficients[0xd];
              case 0xc:
                iVar5 = iVar5 + pResult[-0xd] * coefficients[0xc];
              case 0xb:
                iVar5 = iVar5 + pResult[-0xc] * coefficients[0xb];
              case 10:
                iVar5 = iVar5 + pResult[-0xb] * coefficients[10];
              case 9:
                iVar5 = iVar5 + pResult[-10] * coefficients[9];
              case 8:
                iVar5 = iVar5 + pResult[-9] * coefficients[8];
              case 7:
                iVar5 = iVar5 + pResult[-8] * coefficients[7];
              case 6:
                iVar5 = iVar5 + pResult[-7] * coefficients[6];
              case 5:
                iVar5 = iVar5 + pResult[-6] * coefficients[5];
              case 4:
                iVar5 = iVar5 + pResult[-5] * coefficients[4];
              case 3:
                iVar5 = iVar5 + pResult[-4] * coefficients[3];
              case 2:
                iVar5 = iVar5 + pResult[-3] * coefficients[2];
              case 1:
                iVar5 = iVar5 + pResult[-2] * coefficients[1];
              case 0:
                iVar5 = iVar5 + pResult[-1] * *coefficients;
              default:
                iVar5 = iVar5 >> ((byte)local_80 & 0x1f);
              }
            }
            else {
              lVar6 = 0;
              switch(iVar9) {
              case 0x1f:
                lVar6 = (long)pResult[-0x20] * (long)coefficients[0x1f];
              case 0x1e:
                lVar6 = lVar6 + (long)pResult[-0x1f] * (long)coefficients[0x1e];
              case 0x1d:
                lVar6 = lVar6 + (long)pResult[-0x1e] * (long)coefficients[0x1d];
              case 0x1c:
                lVar6 = lVar6 + (long)pResult[-0x1d] * (long)coefficients[0x1c];
              case 0x1b:
                lVar6 = lVar6 + (long)pResult[-0x1c] * (long)coefficients[0x1b];
              case 0x1a:
                lVar6 = lVar6 + (long)pResult[-0x1b] * (long)coefficients[0x1a];
              case 0x19:
                lVar6 = lVar6 + (long)pResult[-0x1a] * (long)coefficients[0x19];
              case 0x18:
                lVar6 = lVar6 + (long)pResult[-0x19] * (long)coefficients[0x18];
              case 0x17:
                lVar6 = lVar6 + (long)pResult[-0x18] * (long)coefficients[0x17];
              case 0x16:
                lVar6 = lVar6 + (long)pResult[-0x17] * (long)coefficients[0x16];
              case 0x15:
                lVar6 = lVar6 + (long)pResult[-0x16] * (long)coefficients[0x15];
              case 0x14:
                lVar6 = lVar6 + (long)pResult[-0x15] * (long)coefficients[0x14];
              case 0x13:
                lVar6 = lVar6 + (long)pResult[-0x14] * (long)coefficients[0x13];
              case 0x12:
                lVar6 = lVar6 + (long)pResult[-0x13] * (long)coefficients[0x12];
              case 0x11:
                lVar6 = lVar6 + (long)pResult[-0x12] * (long)coefficients[0x11];
              case 0x10:
                lVar6 = lVar6 + (long)pResult[-0x11] * (long)coefficients[0x10];
              case 0xf:
                lVar6 = lVar6 + (long)pResult[-0x10] * (long)coefficients[0xf];
              case 0xe:
                lVar6 = lVar6 + (long)pResult[-0xf] * (long)coefficients[0xe];
              case 0xd:
                lVar6 = lVar6 + (long)pResult[-0xe] * (long)coefficients[0xd];
              case 0xc:
                lVar6 = lVar6 + (long)pResult[-0xd] * (long)coefficients[0xc];
              case 0xb:
                lVar6 = lVar6 + (long)pResult[-0xc] * (long)coefficients[0xb];
              case 10:
                lVar6 = lVar6 + (long)pResult[-0xb] * (long)coefficients[10];
              case 9:
                lVar6 = lVar6 + (long)pResult[-10] * (long)coefficients[9];
              case 8:
                lVar6 = lVar6 + (long)pResult[-9] * (long)coefficients[8];
              case 7:
                lVar6 = lVar6 + (long)pResult[-8] * (long)coefficients[7];
              case 6:
                lVar6 = lVar6 + (long)pResult[-7] * (long)coefficients[6];
              case 5:
                lVar6 = lVar6 + (long)pResult[-6] * (long)coefficients[5];
              case 4:
                lVar6 = lVar6 + (long)pResult[-5] * (long)coefficients[4];
              case 3:
                lVar6 = lVar6 + (long)pResult[-4] * (long)coefficients[3];
              case 2:
                lVar6 = lVar6 + (long)pResult[-3] * (long)coefficients[2];
              case 1:
                lVar6 = lVar6 + (long)pResult[-2] * (long)coefficients[1];
              case 0:
                lVar6 = lVar6 + (long)pResult[-1] * (long)*coefficients;
              default:
                iVar5 = (int)(lVar6 >> ((byte)local_38 & 0x3f));
              }
            }
            *pResult = *pResult + iVar5;
          }
        }
        if (local_74 == 1) {
          return 1;
        }
        local_74 = local_74 + -1;
        local_70 = local_70 + local_50;
        if ((char)local_78 != '\0') {
          mVar3 = local_5c;
        }
      } while( true );
    }
  }
  return mVar3;
}

Assistant:

static ma_bool32 ma_dr_flac__decode_samples_with_residual(ma_dr_flac_bs* bs, ma_uint32 bitsPerSample, ma_uint32 blockSize, ma_uint32 lpcOrder, ma_int32 lpcShift, ma_uint32 lpcPrecision, const ma_int32* coefficients, ma_int32* pDecodedSamples)
{
    ma_uint8 residualMethod;
    ma_uint8 partitionOrder;
    ma_uint32 samplesInPartition;
    ma_uint32 partitionsRemaining;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(blockSize != 0);
    MA_DR_FLAC_ASSERT(pDecodedSamples != NULL);
    if (!ma_dr_flac__read_uint8(bs, 2, &residualMethod)) {
        return MA_FALSE;
    }
    if (residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE && residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
        return MA_FALSE;
    }
    pDecodedSamples += lpcOrder;
    if (!ma_dr_flac__read_uint8(bs, 4, &partitionOrder)) {
        return MA_FALSE;
    }
    if (partitionOrder > 8) {
        return MA_FALSE;
    }
    if ((blockSize / (1 << partitionOrder)) < lpcOrder) {
        return MA_FALSE;
    }
    samplesInPartition = (blockSize / (1 << partitionOrder)) - lpcOrder;
    partitionsRemaining = (1 << partitionOrder);
    for (;;) {
        ma_uint8 riceParam = 0;
        if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE) {
            if (!ma_dr_flac__read_uint8(bs, 4, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 15) {
                riceParam = 0xFF;
            }
        } else if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
            if (!ma_dr_flac__read_uint8(bs, 5, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 31) {
                riceParam = 0xFF;
            }
        }
        if (riceParam != 0xFF) {
            if (!ma_dr_flac__decode_samples_with_residual__rice(bs, bitsPerSample, samplesInPartition, riceParam, lpcOrder, lpcShift, lpcPrecision, coefficients, pDecodedSamples)) {
                return MA_FALSE;
            }
        } else {
            ma_uint8 unencodedBitsPerSample = 0;
            if (!ma_dr_flac__read_uint8(bs, 5, &unencodedBitsPerSample)) {
                return MA_FALSE;
            }
            if (!ma_dr_flac__decode_samples_with_residual__unencoded(bs, bitsPerSample, samplesInPartition, unencodedBitsPerSample, lpcOrder, lpcShift, lpcPrecision, coefficients, pDecodedSamples)) {
                return MA_FALSE;
            }
        }
        pDecodedSamples += samplesInPartition;
        if (partitionsRemaining == 1) {
            break;
        }
        partitionsRemaining -= 1;
        if (partitionOrder != 0) {
            samplesInPartition = blockSize / (1 << partitionOrder);
        }
    }
    return MA_TRUE;
}